

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O0

bool __thiscall Alignment::CalculateMean(Alignment *this)

{
  double dVar1;
  bool bVar2;
  Scalar *pSVar3;
  size_type sVar4;
  long in_RDI;
  exception *e;
  Matrix<double,_3,_1,_0,_3,_1> data;
  iterator __end2;
  iterator __begin2;
  VecVector3d *__range2;
  int i;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff28;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff30;
  Scalar in_stack_ffffffffffffff38;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_ffffffffffffff40;
  Scalar *in_stack_ffffffffffffff58;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff60;
  __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_38;
  long local_30;
  int local_14;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    Eigen::Matrix<double,3,1,0,3,1>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_30 = in_RDI + (long)local_14 * 0x18;
    local_38._M_current =
         (Matrix<double,_3,_1,_0,_3,_1> *)
         std::
         vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ::begin((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_ffffffffffffff28);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::end((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)in_stack_ffffffffffffff28);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
      ::operator*(&local_38);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                (in_stack_ffffffffffffff30,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffff28);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      dVar1 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      *pSVar3 = *pSVar3 + dVar1;
      in_stack_ffffffffffffff60 =
           (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      dVar1 = *(double *)in_stack_ffffffffffffff60;
      in_stack_ffffffffffffff58 =
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      *in_stack_ffffffffffffff58 = *in_stack_ffffffffffffff58 + dVar1;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff38 = *pSVar3;
      in_stack_ffffffffffffff40 =
           (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      *(double *)in_stack_ffffffffffffff40 =
           in_stack_ffffffffffffff38 + *(double *)in_stack_ffffffffffffff40;
      __gnu_cxx::
      __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
      ::operator++(&local_38);
    }
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)(in_RDI + (long)local_14 * 0x18));
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    sVar4 = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)(in_RDI + (long)local_14 * 0x18));
    in_stack_ffffffffffffff28 =
         (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *)std::ostream::operator<<(&std::cout,sVar4);
    std::ostream::operator<<(in_stack_ffffffffffffff28,std::endl<char,std::char_traits<char>>);
  }
  return true;
}

Assistant:

bool Alignment::CalculateMean()
{
    for(int i = 0; i < 2; ++i)
    {
        this->Mean[i] = Vector3d::Zero();
        try
        {
            for(auto data : this->OriginData[i])
            {
                this->Mean[i][0] += (data[0]);
                this->Mean[i][1] += (data[1]);
                this->Mean[i][2] += (data[2]);
            }
            this->Mean[i] /= this->OriginData[i].size();
            cout << OriginData[i].size() << endl; 
        }
        catch(const std::exception& e)
        {
            std::cout << e.what() << '\n';
            return false;
        }
    }
    return true;
}